

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

SerialArena * __thiscall
google::protobuf::internal::SerialArena::New(SerialArena *this,SizedPtr mem,ThreadSafeArena *parent)

{
  SerialArena *pSVar1;
  char *pcVar2;
  Nonnull<const_char_*> pcVar3;
  void *v2;
  
  v2 = mem.p;
  if (v2 < (void *)0x88) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (0x88,(unsigned_long)v2,
                        "kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize <= mem.n");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    ArenaBlock::ArenaBlock((ArenaBlock *)this,(ArenaBlock *)0x0,(size_t)v2);
    pSVar1 = (SerialArena *)ArenaBlock::Pointer((ArenaBlock *)this,0x10);
    pcVar2 = ArenaBlock::Pointer((ArenaBlock *)this,0x88);
    (pSVar1->ptr_)._M_b._M_p = pcVar2;
    pcVar2 = ArenaBlock::Pointer((ArenaBlock *)this,(ulong)this->limit_ & 0xfffffffffffffff8);
    pSVar1->limit_ = pcVar2;
    pcVar2 = ArenaBlock::Pointer((ArenaBlock *)this,0x88);
    pSVar1->prefetch_ptr_ = pcVar2;
    (pSVar1->cleanup_list_).head_ = (Chunk *)0x0;
    (pSVar1->cleanup_list_).next_ = (CleanupNode *)0x0;
    (pSVar1->cleanup_list_).limit_ = (CleanupNode *)0x0;
    (pSVar1->cleanup_list_).prefetch_ptr_ = (char *)0x0;
    (pSVar1->string_block_)._M_b._M_p = (__pointer_type)0x0;
    (pSVar1->string_block_unused_).super___atomic_base<unsigned_long>._M_i = 0;
    (pSVar1->head_)._M_b._M_p = (__pointer_type)this;
    (pSVar1->space_used_).super___atomic_base<unsigned_long>._M_i = 0;
    pcVar2 = this->limit_;
    (pSVar1->space_allocated_).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict)pcVar2
    ;
    pSVar1->parent_ = (ThreadSafeArena *)mem.n;
    pSVar1->cached_block_length_ = '\0';
    pSVar1->cached_blocks_ = (CachedBlock **)0x0;
    if (pcVar2 != (char *)0x0) {
      return pSVar1;
    }
    New((SerialArena *)&stack0xffffffffffffffd0);
  }
  New();
}

Assistant:

SerialArena* SerialArena::New(SizedPtr mem, ThreadSafeArena& parent) {
  ABSL_DCHECK_LE(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize, mem.n);
  ThreadSafeArenaStats::RecordAllocateStats(parent.arena_stats_.MutableStats(),
                                            /*used=*/0, /*allocated=*/mem.n,
                                            /*wasted=*/0);
  auto b = new (mem.p) ArenaBlock{nullptr, mem.n};
  return new (b->Pointer(kBlockHeaderSize)) SerialArena(b, parent);
}